

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5SegIterLoadNPos(Fts5Index *p,Fts5SegIter *pIter)

{
  byte bVar1;
  u8 *puVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long in_FS_OFFSET;
  int nSz;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->rc == 0) {
    iVar6 = (int)pIter->iLeafOffset;
    if (p->pConfig->eDetail == 1) {
      iVar4 = pIter->pLeaf->szLeaf;
      if (pIter->iEndofDoclist < iVar4) {
        iVar4 = pIter->iEndofDoclist;
      }
      pIter->bDel = '\0';
      pIter->nPos = 1;
      if ((iVar6 < iVar4) && (puVar2 = pIter->pLeaf->p, puVar2[iVar6] == '\0')) {
        pIter->bDel = '\x01';
        uVar5 = (long)iVar6 + 1;
        if (((int)uVar5 < iVar4) && (puVar2[uVar5] == '\0')) {
          pIter->nPos = 1;
          uVar5 = (ulong)(iVar6 + 2);
        }
        else {
          pIter->nPos = 0;
        }
      }
      else {
        uVar5 = pIter->iLeafOffset & 0xffffffff;
      }
    }
    else {
      puVar2 = pIter->pLeaf->p;
      bVar1 = puVar2[iVar6];
      local_1c = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        iVar4 = sqlite3Fts5GetVarint32(puVar2 + iVar6,&local_1c);
        uVar3 = iVar4 + iVar6;
      }
      else {
        uVar3 = iVar6 + 1;
      }
      uVar5 = (ulong)uVar3;
      pIter->bDel = (byte)local_1c & 1;
      pIter->nPos = (int)local_1c >> 1;
    }
    pIter->iLeafOffset = (long)(int)uVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5SegIterLoadNPos(Fts5Index *p, Fts5SegIter *pIter){
  if( p->rc==SQLITE_OK ){
    int iOff = pIter->iLeafOffset;  /* Offset to read at */
    ASSERT_SZLEAF_OK(pIter->pLeaf);
    if( p->pConfig->eDetail==FTS5_DETAIL_NONE ){
      int iEod = MIN(pIter->iEndofDoclist, pIter->pLeaf->szLeaf);
      pIter->bDel = 0;
      pIter->nPos = 1;
      if( iOff<iEod && pIter->pLeaf->p[iOff]==0 ){
        pIter->bDel = 1;
        iOff++;
        if( iOff<iEod && pIter->pLeaf->p[iOff]==0 ){
          pIter->nPos = 1;
          iOff++;
        }else{
          pIter->nPos = 0;
        }
      }
    }else{
      int nSz;
      fts5FastGetVarint32(pIter->pLeaf->p, iOff, nSz);
      pIter->bDel = (nSz & 0x0001);
      pIter->nPos = nSz>>1;
      assert_nc( pIter->nPos>=0 );
    }
    pIter->iLeafOffset = iOff;
  }
}